

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_infix(CPState *cp,CPValue *k,int pri)

{
  int iVar1;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar2;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar3;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar4;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar5;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar6;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar7;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar8;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar9;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar10;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar11;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar12;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar13;
  bool local_42;
  bool local_41;
  CTypeID local_40;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_3c;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_2c;
  uint local_28;
  CPValue k3;
  CPValue k2;
  int pri_local;
  CPValue *k_local;
  CPState *cp_local;
  
  k3.field_0.i32 = 0;
  k3.id = 0;
  do {
    switch(pri) {
    case 0:
      iVar1 = cp_opt(cp,0x3f);
      if (iVar1 == 0) goto switchD_00186814_caseD_1;
      cp_expr_comma(cp,&k3);
      cp_check(cp,0x3a);
      cp_expr_sub(cp,(CPValue *)&local_2c,0);
      if ((k->field_0).i32 == 0) {
        local_3c = local_2c;
      }
      else {
        local_3c = k3.field_0;
      }
      k->field_0 = local_3c;
      if (local_28 < k3.id) {
        local_40 = k3.id;
      }
      else {
        local_40 = local_28;
      }
      k->id = local_40;
      break;
    case 1:
switchD_00186814_caseD_1:
      iVar1 = cp_opt(cp,0x104);
      if (iVar1 != 0) {
        cp_expr_sub(cp,&k3,2);
        local_41 = (k->field_0).i32 != 0 || k3.field_0.i32 != 0;
        aVar2.i32._1_3_ = 0;
        aVar2.i32._0_1_ = local_41;
        k->field_0 = aVar2;
        k->id = 9;
        break;
      }
    case 2:
      iVar1 = cp_opt(cp,0x105);
      if (iVar1 != 0) {
        cp_expr_sub(cp,&k3,3);
        local_42 = (k->field_0).i32 != 0 && k3.field_0.i32 != 0;
        aVar3.i32._1_3_ = 0;
        aVar3.i32._0_1_ = local_42;
        k->field_0 = aVar3;
        k->id = 9;
        break;
      }
switchD_00186814_caseD_3:
      iVar1 = cp_opt(cp,0x7c);
      if (iVar1 == 0) {
switchD_00186814_caseD_4:
        iVar1 = cp_opt(cp,0x5e);
        if (iVar1 == 0) {
switchD_00186814_caseD_5:
          iVar1 = cp_opt(cp,0x26);
          if (iVar1 == 0) {
switchD_00186814_caseD_6:
            iVar1 = cp_opt(cp,0x106);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,7);
              aVar4.i32._1_3_ = 0;
              aVar4.i32._0_1_ = (k->field_0).i32 == k3.field_0.i32;
              k->field_0 = aVar4;
              k->id = 9;
              break;
            }
            iVar1 = cp_opt(cp,0x107);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,7);
              aVar5.i32._1_3_ = 0;
              aVar5.i32._0_1_ = (k->field_0).i32 != k3.field_0.i32;
              k->field_0 = aVar5;
              k->id = 9;
              break;
            }
switchD_00186814_caseD_7:
            iVar1 = cp_opt(cp,0x3c);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,8);
              if ((k->id == 9) && (k3.id == 9)) {
                aVar6.i32._1_3_ = 0;
                aVar6.i32._0_1_ = (k->field_0).i32 < k3.field_0.i32;
                k->field_0 = aVar6;
              }
              else {
                aVar7.i32._1_3_ = 0;
                aVar7.i32._0_1_ = (k->field_0).u32 < k3.field_0.u32;
                k->field_0 = aVar7;
              }
              k->id = 9;
              break;
            }
            iVar1 = cp_opt(cp,0x3e);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,8);
              if ((k->id == 9) && (k3.id == 9)) {
                aVar8.i32._1_3_ = 0;
                aVar8.i32._0_1_ = k3.field_0.i32 < (k->field_0).i32;
                k->field_0 = aVar8;
              }
              else {
                aVar9.i32._1_3_ = 0;
                aVar9.i32._0_1_ = k3.field_0.u32 < (k->field_0).u32;
                k->field_0 = aVar9;
              }
              k->id = 9;
              break;
            }
            iVar1 = cp_opt(cp,0x108);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,8);
              if ((k->id == 9) && (k3.id == 9)) {
                aVar10.i32._1_3_ = 0;
                aVar10.i32._0_1_ = (k->field_0).i32 <= k3.field_0.i32;
                k->field_0 = aVar10;
              }
              else {
                aVar11.i32._1_3_ = 0;
                aVar11.i32._0_1_ = (k->field_0).u32 <= k3.field_0.u32;
                k->field_0 = aVar11;
              }
              k->id = 9;
              break;
            }
            iVar1 = cp_opt(cp,0x109);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,8);
              if ((k->id == 9) && (k3.id == 9)) {
                aVar12.i32._1_3_ = 0;
                aVar12.i32._0_1_ = k3.field_0.i32 <= (k->field_0).i32;
                k->field_0 = aVar12;
              }
              else {
                aVar13.i32._1_3_ = 0;
                aVar13.i32._0_1_ = k3.field_0.u32 <= (k->field_0).u32;
                k->field_0 = aVar13;
              }
              k->id = 9;
              break;
            }
switchD_00186814_caseD_8:
            iVar1 = cp_opt(cp,0x10a);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,9);
              (k->field_0).u32 = (k->field_0).u32 << ((byte)k3.field_0.u32 & 0x1f);
              break;
            }
            iVar1 = cp_opt(cp,0x10b);
            if (iVar1 != 0) {
              cp_expr_sub(cp,&k3,9);
              if (k->id == 9) {
                (k->field_0).i32 = (k->field_0).i32 >> ((byte)k3.field_0.u32 & 0x1f);
              }
              else {
                (k->field_0).u32 = (k->field_0).u32 >> ((byte)k3.field_0.u32 & 0x1f);
              }
              break;
            }
switchD_00186814_caseD_9:
            iVar1 = cp_opt(cp,0x2b);
            if (iVar1 == 0) {
              iVar1 = cp_opt(cp,0x2d);
              if (iVar1 == 0) {
switchD_00186814_caseD_a:
                iVar1 = cp_opt(cp,0x2a);
                if (iVar1 == 0) {
                  iVar1 = cp_opt(cp,0x2f);
                  if (iVar1 == 0) {
                    iVar1 = cp_opt(cp,0x25);
                    if (iVar1 == 0) {
                      return;
                    }
                    cp_expr_unary(cp,&k3);
                    if (k->id < k3.id) {
                      k->id = k3.id;
                    }
                    if ((k3.field_0.i32 == 0) ||
                       (((k->id == 9 && ((k->field_0).i32 == -0x80000000)) && (k3.field_0.i32 == -1)
                        ))) {
                      cp_err(cp,LJ_ERR_BADVAL);
                    }
                    if (k->id == 9) {
                      (k->field_0).i32 = (k->field_0).i32 % k3.field_0.i32;
                    }
                    else {
                      (k->field_0).u32 = (k->field_0).u32 % k3.field_0.u32;
                    }
                  }
                  else {
                    cp_expr_unary(cp,&k3);
                    if (k->id < k3.id) {
                      k->id = k3.id;
                    }
                    if ((k3.field_0.i32 == 0) ||
                       (((k->id == 9 && ((k->field_0).i32 == -0x80000000)) && (k3.field_0.i32 == -1)
                        ))) {
                      cp_err(cp,LJ_ERR_BADVAL);
                    }
                    if (k->id == 9) {
                      (k->field_0).i32 = (k->field_0).i32 / k3.field_0.i32;
                    }
                    else {
                      (k->field_0).u32 = (k->field_0).u32 / k3.field_0.u32;
                    }
                  }
                  break;
                }
                cp_expr_unary(cp,&k3);
                (k->field_0).i32 = (k->field_0).i32 * k3.field_0.i32;
              }
              else {
                cp_expr_sub(cp,&k3,10);
                (k->field_0).i32 = (k->field_0).i32 - (int)k3.field_0;
              }
            }
            else {
              cp_expr_sub(cp,&k3,10);
              (k->field_0).i32 = (k->field_0).i32 + k3.field_0.i32;
            }
          }
          else {
            cp_expr_sub(cp,&k3,6);
            (k->field_0).u32 = (k->field_0).u32 & k3.field_0.u32;
          }
        }
        else {
          cp_expr_sub(cp,&k3,5);
          (k->field_0).u32 = (k->field_0).u32 ^ k3.field_0.u32;
        }
      }
      else {
        cp_expr_sub(cp,&k3,4);
        (k->field_0).u32 = (k->field_0).u32 | k3.field_0.u32;
      }
      if (k->id < k3.id) {
        k->id = k3.id;
      }
      break;
    case 3:
      goto switchD_00186814_caseD_3;
    case 4:
      goto switchD_00186814_caseD_4;
    case 5:
      goto switchD_00186814_caseD_5;
    case 6:
      goto switchD_00186814_caseD_6;
    case 7:
      goto switchD_00186814_caseD_7;
    case 8:
      goto switchD_00186814_caseD_8;
    case 9:
      goto switchD_00186814_caseD_9;
    case 10:
      goto switchD_00186814_caseD_a;
    default:
      return;
    }
  } while( true );
}

Assistant:

static void cp_expr_infix(CPState *cp, CPValue *k, int pri)
{
  CPValue k2;
  k2.u32 = 0; k2.id = 0;  /* Silence the compiler. */
  for (;;) {
    switch (pri) {
    case 0:
      if (cp_opt(cp, '?')) {
	CPValue k3;
	cp_expr_comma(cp, &k2);  /* Right-associative. */
	cp_check(cp, ':');
	cp_expr_sub(cp, &k3, 0);
	k->u32 = k->u32 ? k2.u32 : k3.u32;
	k->id = k2.id > k3.id ? k2.id : k3.id;
	continue;
      }
      /* fallthrough */
    case 1:
      if (cp_opt(cp, CTOK_OROR)) {
	cp_expr_sub(cp, &k2, 2); k->i32 = k->u32 || k2.u32; k->id = CTID_INT32;
	continue;
      }
      /* fallthrough */
    case 2:
      if (cp_opt(cp, CTOK_ANDAND)) {
	cp_expr_sub(cp, &k2, 3); k->i32 = k->u32 && k2.u32; k->id = CTID_INT32;
	continue;
      }
      /* fallthrough */
    case 3:
      if (cp_opt(cp, '|')) {
	cp_expr_sub(cp, &k2, 4); k->u32 = k->u32 | k2.u32; goto arith_result;
      }
      /* fallthrough */
    case 4:
      if (cp_opt(cp, '^')) {
	cp_expr_sub(cp, &k2, 5); k->u32 = k->u32 ^ k2.u32; goto arith_result;
      }
      /* fallthrough */
    case 5:
      if (cp_opt(cp, '&')) {
	cp_expr_sub(cp, &k2, 6); k->u32 = k->u32 & k2.u32; goto arith_result;
      }
      /* fallthrough */
    case 6:
      if (cp_opt(cp, CTOK_EQ)) {
	cp_expr_sub(cp, &k2, 7); k->i32 = k->u32 == k2.u32; k->id = CTID_INT32;
	continue;
      } else if (cp_opt(cp, CTOK_NE)) {
	cp_expr_sub(cp, &k2, 7); k->i32 = k->u32 != k2.u32; k->id = CTID_INT32;
	continue;
      }
      /* fallthrough */
    case 7:
      if (cp_opt(cp, '<')) {
	cp_expr_sub(cp, &k2, 8);
	if (k->id == CTID_INT32 && k2.id == CTID_INT32)
	  k->i32 = k->i32 < k2.i32;
	else
	  k->i32 = k->u32 < k2.u32;
	k->id = CTID_INT32;
	continue;
      } else if (cp_opt(cp, '>')) {
	cp_expr_sub(cp, &k2, 8);
	if (k->id == CTID_INT32 && k2.id == CTID_INT32)
	  k->i32 = k->i32 > k2.i32;
	else
	  k->i32 = k->u32 > k2.u32;
	k->id = CTID_INT32;
	continue;
      } else if (cp_opt(cp, CTOK_LE)) {
	cp_expr_sub(cp, &k2, 8);
	if (k->id == CTID_INT32 && k2.id == CTID_INT32)
	  k->i32 = k->i32 <= k2.i32;
	else
	  k->i32 = k->u32 <= k2.u32;
	k->id = CTID_INT32;
	continue;
      } else if (cp_opt(cp, CTOK_GE)) {
	cp_expr_sub(cp, &k2, 8);
	if (k->id == CTID_INT32 && k2.id == CTID_INT32)
	  k->i32 = k->i32 >= k2.i32;
	else
	  k->i32 = k->u32 >= k2.u32;
	k->id = CTID_INT32;
	continue;
      }
      /* fallthrough */
    case 8:
      if (cp_opt(cp, CTOK_SHL)) {
	cp_expr_sub(cp, &k2, 9); k->u32 = k->u32 << k2.u32;
	continue;
      } else if (cp_opt(cp, CTOK_SHR)) {
	cp_expr_sub(cp, &k2, 9);
	if (k->id == CTID_INT32)
	  k->i32 = k->i32 >> k2.i32;
	else
	  k->u32 = k->u32 >> k2.u32;
	continue;
      }
      /* fallthrough */
    case 9:
      if (cp_opt(cp, '+')) {
	cp_expr_sub(cp, &k2, 10); k->u32 = k->u32 + k2.u32;
      arith_result:
	if (k2.id > k->id) k->id = k2.id;  /* Trivial promotion to unsigned. */
	continue;
      } else if (cp_opt(cp, '-')) {
	cp_expr_sub(cp, &k2, 10); k->u32 = k->u32 - k2.u32; goto arith_result;
      }
      /* fallthrough */
    case 10:
      if (cp_opt(cp, '*')) {
	cp_expr_unary(cp, &k2); k->u32 = k->u32 * k2.u32; goto arith_result;
      } else if (cp_opt(cp, '/')) {
	cp_expr_unary(cp, &k2);
	if (k2.id > k->id) k->id = k2.id;  /* Trivial promotion to unsigned. */
	if (k2.u32 == 0 ||
	    (k->id == CTID_INT32 && k->u32 == 0x80000000u && k2.i32 == -1))
	  cp_err(cp, LJ_ERR_BADVAL);
	if (k->id == CTID_INT32)
	  k->i32 = k->i32 / k2.i32;
	else
	  k->u32 = k->u32 / k2.u32;
	continue;
      } else if (cp_opt(cp, '%')) {
	cp_expr_unary(cp, &k2);
	if (k2.id > k->id) k->id = k2.id;  /* Trivial promotion to unsigned. */
	if (k2.u32 == 0 ||
	    (k->id == CTID_INT32 && k->u32 == 0x80000000u && k2.i32 == -1))
	  cp_err(cp, LJ_ERR_BADVAL);
	if (k->id == CTID_INT32)
	  k->i32 = k->i32 % k2.i32;
	else
	  k->u32 = k->u32 % k2.u32;
	continue;
      }
    default:
      return;
    }
  }
}